

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ToolBar::_q_leftArrowClicked(ToolBar *this)

{
  int *piVar1;
  int iVar2;
  ToolBarPrivate *pTVar3;
  ToolBarLayout *pTVar4;
  int iVar5;
  
  pTVar3 = (this->d).d;
  pTVar4 = pTVar3->layout;
  iVar2 = (&(pTVar3->iconSize).wd)[pTVar4->orient != Horizontal];
  iVar5 = (**(code **)(*(long *)pTVar4 + 0x60))();
  piVar1 = &((this->d).d)->layout->offset;
  *piVar1 = *piVar1 - (iVar5 + iVar2);
  QLayout::update();
  QWidget::update();
  return;
}

Assistant:

void
ToolBar::_q_leftArrowClicked()
{
	int delta = 0;

	if( d->layout->orientation() == Qt::Horizontal )
		delta = - d->iconSize.width() - d->layout->spacing();
	else
		delta = - d->iconSize.height() - d->layout->spacing();

	d->layout->setOffset( delta );

	update();
}